

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurvesTests.cpp
# Opt level: O0

void __thiscall agge::tests::ArcCurveTests::ArcPointsAreOnCircle(ArcCurveTests *this)

{
  byte bVar1;
  double x_00;
  double y_00;
  allocator local_1e1;
  string local_1e0 [32];
  LocationInfo local_1c0;
  path_commands local_198;
  allocator local_191;
  string local_190 [32];
  LocationInfo local_170;
  allocator local_141;
  string local_140 [32];
  LocationInfo local_120;
  allocator local_f1;
  string local_f0 [32];
  LocationInfo local_d0;
  allocator local_91;
  string local_90 [32];
  LocationInfo local_70;
  undefined1 local_48 [8];
  arc a;
  real_t prev_y;
  real_t prev_x;
  real_t y;
  real_t x;
  int command;
  bool had_output;
  ArcCurveTests *this_local;
  
  x._3_1_ = 0;
  _command = this;
  arc::arc((arc *)local_48,13.1,-17.2,10.1,0.0,1.5707964,0.05);
  arc::vertex((arc *)local_48,&prev_x,&prev_y);
  while( true ) {
    y = (real_t)arc::vertex((arc *)local_48,&prev_x,&prev_y);
    bVar1 = x._3_1_;
    if (y != 2.8026e-45) break;
    x._3_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
               ,&local_91);
    ut::LocationInfo::LocationInfo(&local_70,(string *)local_90,0x156);
    ut::are_not_equal<float,float>(&a._step,&prev_x,&local_70);
    ut::LocationInfo::~LocationInfo(&local_70);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
               ,&local_f1);
    ut::LocationInfo::LocationInfo(&local_d0,(string *)local_f0,0x157);
    ut::are_not_equal<float,float>(&a._end,&prev_y,&local_d0);
    ut::LocationInfo::~LocationInfo(&local_d0);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    x_00 = (double)prev_x;
    y_00 = (double)prev_y;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_140,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
               ,&local_141);
    ut::LocationInfo::LocationInfo(&local_120,(string *)local_140,0x158);
    ut::is_on_circle(13.100000381469727,-17.200000762939453,10.100000381469727,x_00,y_00,&local_120)
    ;
    ut::LocationInfo::~LocationInfo(&local_120);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,&local_191);
  ut::LocationInfo::LocationInfo(&local_170,(string *)local_190,0x15d);
  ut::is_true((bool)(bVar1 & 1),&local_170);
  ut::LocationInfo::~LocationInfo(&local_170);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  local_198 = path_command_stop;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1e0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,&local_1e1);
  ut::LocationInfo::LocationInfo(&local_1c0,(string *)local_1e0,0x15e);
  ut::are_equal<agge::path_commands,int>(&local_198,(int *)&y,&local_1c0);
  ut::LocationInfo::~LocationInfo(&local_1c0);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  return;
}

Assistant:

test( ArcPointsAreOnCircle )
			{
				// INIT
				bool had_output = false;
				int command;
				real_t x, y, prev_x, prev_y;
				arc a(13.1f, -17.2f, 10.1f, 0.0f * pi, 0.5f * pi);

				a.vertex(&x, &y);
				prev_x = x, prev_y = y;

				// ACT / ASSERT
				while (command = a.vertex(&x, &y), command == path_command_line_to)
				{
					had_output = true;
					assert_not_equal(prev_x, x);
					assert_not_equal(prev_y, y);
					assert_point_on_circle(13.1f, -17.2f, 10.1f, x, y);
					prev_x = x, prev_y = y;
				}

				// ASSERT
				assert_is_true(had_output);
				assert_equal(path_command_stop, command);
			}